

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O0

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<float,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::tanh_sinh_detail(tanh_sinh_detail<float,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                   *this,size_t max_refinements,float *min_complement)

{
  EVP_PKEY_CTX *in_RDX;
  size_t in_RSI;
  tanh_sinh_detail<float,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  *in_RDI;
  
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)0x117c79);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)0x117c8c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x117c9f);
  in_RDI->m_max_refinements = in_RSI;
  boost::detail::lightweight_mutex::lightweight_mutex((lightweight_mutex *)0x117cb6);
  init(in_RDI,in_RDX);
  return;
}

Assistant:

tanh_sinh_detail(size_t max_refinements, const Real& min_complement) : m_max_refinements(max_refinements)
    {
       typedef std::integral_constant<int, initializer_selector> tag_type;
       init(min_complement, tag_type());
    }